

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O3

void __thiscall UdpSocketImpl::Close(UdpSocketImpl *this)

{
  int iVar1;
  
  this->m_bCloseReq = true;
  do {
    iVar1 = pthread_mutex_trylock((pthread_mutex_t *)&this->m_mxWrite);
    std::condition_variable::notify_all();
    if (iVar1 == 0) {
      pthread_mutex_unlock((pthread_mutex_t *)&this->m_mxWrite);
    }
  } while ((((this->super_BaseSocketImpl).m_iShutDownState.super___atomic_base<unsigned_char>._M_i &
            2) == 0) && ((this->super_BaseSocketImpl).m_iError == 0));
  (this->super_BaseSocketImpl).m_bStop = true;
  return;
}

Assistant:

void UdpSocketImpl::Close()
{
    m_bCloseReq = true; // Stops the write thread after the last byte was send
    do
    {
        const bool bIsLocked = m_mxWrite.try_lock();
        m_cv.notify_all();
        if (bIsLocked == true)
            m_mxWrite.unlock();
    } while ((m_iShutDownState & 2) == 0 && m_iError == 0); // Wait until the write thread is finished
    m_bStop = true; // Stops the listening thread
}